

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# judger.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  key_type *__k;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  long *plVar7;
  long lVar8;
  mapped_type *pmVar9;
  iterator iVar10;
  int *piVar11;
  undefined8 *puVar12;
  iterator iVar13;
  mapped_type *pmVar14;
  ostream *poVar15;
  size_type *psVar16;
  undefined8 uVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  key_type *__k_00;
  uint uVar22;
  uint uVar23;
  int id [11];
  int rank [11];
  string ppath;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  parm;
  string replayFile;
  string __str;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  aipath;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  name;
  key_type local_1a8;
  undefined4 uStack_188;
  undefined8 uStack_184;
  undefined8 local_178;
  ulong local_170;
  key_type local_168;
  undefined4 uStack_148;
  undefined8 uStack_144;
  key_type local_138;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_118;
  key_type local_e8;
  ulong local_c8;
  long local_c0;
  ulong local_b8;
  char *local_b0 [2];
  char local_a0 [16];
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  __k_00 = &local_1a8;
  local_118._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_118._M_impl.super__Rb_tree_header._M_header;
  local_118._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_118._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_118._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118._M_impl.super__Rb_tree_header._M_header._M_right =
       local_118._M_impl.super__Rb_tree_header._M_header._M_left;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (argc == 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"AI9 2018 Judger",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    plVar7 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    std::ostream::put((char)plVar7);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_5518,0xd);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"-players=M      Set the number of players to M.",0x2f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "-rounds=R       Set the maximum round to R (optional, default is 3000).",0x47);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "-replay=F       Set the replay file name to F (optional, default is replay.zip).",
               0x50);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "-nameX=N        Set the name of player #X to N (optional, default is \"Attendant\")."
               ,0x52);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"-pathX=P        Set the AI path of player #X to P.",0x32);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"The range of X is from 0 to M-1.",0x20);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Unrecognized parameters will be ignored.",0x28);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Example. ./judger -players=3 -rounds=2000 -path0=ai0.so -path1=\"ai0.so\" -path2=\"ai/ai0.so\""
               ,0x5a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    iVar19 = 0;
    std::ostream::flush();
    goto LAB_00119ac6;
  }
  local_178 = 0;
  if (1 < argc) {
    local_170 = (ulong)(uint)argc;
    local_178 = 0;
    uVar20 = 1;
    do {
      std::__cxx11::string::string((string *)&local_1a8,argv[uVar20],(allocator *)&local_168);
      lVar8 = std::__cxx11::string::find((char)&local_1a8,0x3d);
      if (((local_1a8._M_string_length == 0) || (lVar8 == -1)) ||
         (*local_1a8._M_dataplus._M_p != '-')) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Parameter format incorrect!",0x1b);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
        local_178 = 1;
        bVar4 = false;
      }
      else {
        std::__cxx11::string::substr((ulong)&local_168,(ulong)&local_1a8);
        std::__cxx11::string::substr((ulong)&local_e8,(ulong)&local_1a8);
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&local_118,&local_e8);
        std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_168);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p);
        }
        bVar4 = true;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      if (!bVar4) {
        iVar19 = (int)local_178;
        goto LAB_00119ac6;
      }
      uVar20 = uVar20 + 1;
    } while (local_170 != uVar20);
  }
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"players","");
  iVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&local_118,&local_1a8);
  uVar17 = local_178;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  if ((_Rb_tree_header *)iVar10._M_node == &local_118._M_impl.super__Rb_tree_header) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Player count not given!",0x17);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    iVar19 = 1;
    std::ostream::flush();
    goto LAB_00119ac6;
  }
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"players","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_118,&local_1a8);
  pcVar2 = (pmVar9->_M_dataplus)._M_p;
  piVar11 = __errno_location();
  iVar19 = *piVar11;
  *piVar11 = 0;
  uVar20 = strtol(pcVar2,(char **)&local_168,10);
  if (local_168._M_dataplus._M_p == pcVar2) {
    std::__throw_invalid_argument("stoi");
LAB_00119b0d:
    std::__throw_out_of_range("stoi");
  }
  else {
    uVar22 = (uint)uVar20;
    if (((long)(int)uVar22 != uVar20) || (*piVar11 == 0x22)) goto LAB_00119b0d;
    if (*piVar11 == 0) {
      *piVar11 = iVar19;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p);
    }
    if (uVar22 - 9 < 0xfffffff9) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Player count out of range!",0x1a);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
      std::ostream::put(-0x70);
      iVar19 = 1;
      std::ostream::flush();
      goto LAB_00119ac6;
    }
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"rounds","");
    iVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&local_118,&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p);
    }
    if ((_Rb_tree_header *)iVar10._M_node == &local_118._M_impl.super__Rb_tree_header) {
      lVar8 = 0x44c;
LAB_00119480:
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"replay.zip","");
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"replay","");
      iVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(&local_118,&local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      if ((_Rb_tree_header *)iVar10._M_node != &local_118._M_impl.super__Rb_tree_header) {
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"replay","");
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_118,&local_1a8);
        std::__cxx11::string::_M_assign((string *)&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p);
        }
      }
      setReplayFile(local_e8._M_dataplus._M_p);
      init((EVP_PKEY_CTX *)(uVar20 & 0xffffffff));
      uStack_188 = 0;
      uStack_184 = 0;
      local_1a8.field_2._M_allocated_capacity = 0;
      local_1a8.field_2._8_4_ = 0;
      local_1a8.field_2._12_4_ = 0;
      local_1a8._M_dataplus._M_p = (pointer)0x0;
      local_1a8._M_string_length = 0;
      local_c0 = lVar8;
      getPlayerIDs((int *)&local_1a8);
      paVar1 = &local_138.field_2;
      local_b8 = (ulong)(uVar22 & 0x7fffffff);
      local_170 = CONCAT71(local_170._1_7_,1);
      uVar21 = 0;
      local_c8 = uVar20;
      do {
        uVar23 = 1;
        uVar22 = (uint)uVar21;
        if (9 < uVar21) {
          uVar3 = 4;
          uVar20 = uVar21;
          do {
            uVar23 = uVar3;
            uVar5 = (uint)uVar20;
            if (uVar5 < 100) {
              uVar23 = uVar23 - 2;
              goto LAB_001195fb;
            }
            if (uVar5 < 1000) {
              uVar23 = uVar23 - 1;
              goto LAB_001195fb;
            }
            if (uVar5 < 10000) goto LAB_001195fb;
            uVar20 = (uVar20 & 0xffffffff) / 10000;
            uVar3 = uVar23 + 4;
          } while (99999 < uVar5);
          uVar23 = uVar23 + 1;
        }
LAB_001195fb:
        local_138._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct((ulong)&local_138,(char)uVar23);
        std::__detail::__to_chars_10_impl<unsigned_int>(local_138._M_dataplus._M_p,uVar23,uVar22);
        puVar12 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,0x142ace);
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        psVar16 = puVar12 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_168.field_2._M_allocated_capacity = *psVar16;
          local_168.field_2._8_4_ = (undefined4)puVar12[3];
          local_168.field_2._12_4_ = (undefined4)((ulong)puVar12[3] >> 0x20);
        }
        else {
          local_168.field_2._M_allocated_capacity = *psVar16;
          local_168._M_dataplus._M_p = (pointer)*puVar12;
        }
        local_168._M_string_length = puVar12[1];
        *puVar12 = psVar16;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar1) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        uVar23 = 1;
        if (9 < uVar21) {
          uVar3 = 4;
          uVar20 = uVar21;
          do {
            uVar23 = uVar3;
            uVar5 = (uint)uVar20;
            if (uVar5 < 100) {
              uVar23 = uVar23 - 2;
              goto LAB_001196f1;
            }
            if (uVar5 < 1000) {
              uVar23 = uVar23 - 1;
              goto LAB_001196f1;
            }
            if (uVar5 < 10000) goto LAB_001196f1;
            uVar20 = (uVar20 & 0xffffffff) / 10000;
            uVar3 = uVar23 + 4;
          } while (99999 < uVar5);
          uVar23 = uVar23 + 1;
        }
LAB_001196f1:
        local_b0[0] = local_a0;
        std::__cxx11::string::_M_construct((ulong)local_b0,(char)uVar23);
        std::__detail::__to_chars_10_impl<unsigned_int>(local_b0[0],uVar23,uVar22);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)local_b0,0,(char *)0x0,0x142286);
        psVar16 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar16) {
          local_138.field_2._M_allocated_capacity = *psVar16;
          local_138.field_2._8_8_ = plVar7[3];
          local_138._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_138.field_2._M_allocated_capacity = *psVar16;
          local_138._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_138._M_string_length = plVar7[1];
        *plVar7 = (long)psVar16;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_b0[0] != local_a0) {
          operator_delete(local_b0[0]);
        }
        iVar10 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find(&local_118,&local_138);
        if ((_Rb_tree_header *)iVar10._M_node == &local_118._M_impl.super__Rb_tree_header) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"AI path of player #",0x13);
          poVar15 = (ostream *)std::ostream::operator<<(&std::cout,uVar22);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15," not specified!",0xf);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
          std::ostream::put((char)poVar15);
          uVar17 = 1;
          std::ostream::flush();
        }
        else {
          iVar13 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find(&local_118,&local_168);
          if ((_Rb_tree_header *)iVar13._M_node == &local_118._M_impl.super__Rb_tree_header) {
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&local_118,&local_168);
            std::__cxx11::string::_M_replace
                      ((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,0x1422af);
          }
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_118,&local_168);
          __k = (key_type *)((long)&local_1a8._M_dataplus._M_p + uVar21 * 4);
          pmVar14 = std::
                    map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&local_60,__k);
          std::__cxx11::string::_M_assign((string *)pmVar14);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_118,&local_138);
          pmVar14 = std::
                    map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&local_90,__k);
          std::__cxx11::string::_M_assign((string *)pmVar14);
          iVar19 = *__k;
          pmVar14 = std::
                    map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&local_60,__k);
          setPlayerName(iVar19,(pmVar14->_M_dataplus)._M_p);
        }
        iVar19 = (int)uVar17;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar1) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p);
        }
        lVar8 = local_c0;
        if ((_Rb_tree_header *)iVar10._M_node == &local_118._M_impl.super__Rb_tree_header) break;
        uVar21 = uVar21 + 1;
        local_170 = CONCAT71(local_170._1_7_,uVar21 < local_b8);
      } while (uVar21 != local_b8);
      if ((local_170 & 1) == 0) {
        uVar20 = (ulong)((uint)local_c8 & 0x7fffffff);
        do {
          pmVar14 = std::
                    map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&local_90,(key_type *)__k_00);
          bVar4 = loadAI((pmVar14->_M_dataplus)._M_p,*(int *)__k_00);
          uVar21 = local_c8;
          if (!bVar4) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Failed to load ",0xf);
            pmVar14 = std::
                      map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&local_90,(key_type *)__k_00);
            poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,(pmVar14->_M_dataplus)._M_p,
                                 pmVar14->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,"!",1);
            iVar19 = 1;
            std::endl<char,std::char_traits<char>>(poVar15);
            goto LAB_00119aac;
          }
          __k_00 = (key_type *)((long)__k_00 + 4);
          uVar20 = uVar20 - 1;
        } while (uVar20 != 0);
        iVar19 = (int)lVar8;
        if (0 < iVar19) {
          do {
            iVar19 = iVar19 + -1;
            invokeAI();
            run();
            iVar6 = checkWin();
            if (iVar6 != -1) break;
          } while (iVar19 != 0);
        }
        uStack_148 = 0;
        uStack_144 = 0;
        local_168.field_2._M_allocated_capacity = 0;
        local_168.field_2._8_4_ = 0;
        local_168.field_2._12_4_ = 0;
        local_168._M_dataplus._M_p = (pointer)0x0;
        local_168._M_string_length = 0;
        getRank((int *)&local_168);
        uVar21 = (ulong)((uint)uVar21 & 0x7fffffff);
        uVar20 = 0;
        do {
          uVar18 = 0;
          do {
            if (*(int *)((long)&local_168._M_dataplus._M_p + uVar20 * 4) ==
                *(int *)((long)&local_1a8._M_dataplus._M_p + uVar18 * 4)) {
              poVar15 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar18);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
              break;
            }
            uVar18 = uVar18 + 1;
          } while (uVar21 != uVar18);
          uVar20 = uVar20 + 1;
        } while (uVar20 != uVar21);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        closeReplayFile();
        iVar19 = 0;
      }
LAB_00119aac:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
LAB_00119ac6:
      std::
      _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_90);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_60);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_118);
      return iVar19;
    }
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"rounds","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&local_118,&local_1a8);
    pcVar2 = (pmVar9->_M_dataplus)._M_p;
    iVar19 = *piVar11;
    *piVar11 = 0;
    lVar8 = strtol(pcVar2,(char **)&local_168,10);
    if (local_168._M_dataplus._M_p != pcVar2) {
      if ((lVar8 - 0x80000000U < 0xffffffff00000000) || (*piVar11 == 0x22)) goto LAB_00119b25;
      if (*piVar11 == 0) {
        *piVar11 = iVar19;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      goto LAB_00119480;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_00119b25:
  uVar17 = std::__throw_out_of_range("stoi");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_118);
  _Unwind_Resume(uVar17);
}

Assistant:

int main(int argc, char** argv)
{
    map<string, string> parm;
    map<int, string> name, aipath;

    if (argc == 1)
    {
        cout << "AI9 2018 Judger" << endl << endl;
        cout << "Parameters：" << endl;
        cout << "-players=M      Set the number of players to M." << endl;
        cout << "-rounds=R       Set the maximum round to R (optional, default is 3000)." << endl;
        cout << "-replay=F       Set the replay file name to F (optional, default is replay.zip)." << endl;
        cout << "-nameX=N        Set the name of player #X to N (optional, default is \"Attendant\")." << endl;
        cout << "-pathX=P        Set the AI path of player #X to P." << endl;
        cout << endl;
        cout << "The range of X is from 0 to M-1." << endl;
        cout << "Unrecognized parameters will be ignored." << endl;
        cout << endl;
#if defined(_WIN32)
        cout << "Example. ./judger -players=3 -rounds=2000 -path0=ai0.dll -path1=\"ai0.dll\" -path2=\"ai/ai0.dll\"" << endl;
#elif defined(__APPLE__)
        cout << "Example. ./judger -players=3 -rounds=2000 -path0=ai0.dylib -path1=\"ai0.dylib\" -path2=\"ai/ai0.dylib\"" << endl;
#else
        cout << "Example. ./judger -players=3 -rounds=2000 -path0=ai0.so -path1=\"ai0.so\" -path2=\"ai/ai0.so\"" << endl;
#endif
        return 0;
    }

    for (int i = 1; i < argc; ++i)
    {
        string s(argv[i]);
        size_t pos = s.find('=');
        if (s.length() == 0 || s[0] != '-' || pos == string::npos)
        {
            cout << "Parameter format incorrect!" << endl;
            return 1;
        }
        parm[s.substr(1, pos - 1)] = s.substr(pos + 1);
    }

    if (parm.find("players") == parm.end())
    {
        cout << "Player count not given!" << endl;
        return 1;
    }
    int playerNum = stoi(parm["players"]);
    if (playerNum < 2 || playerNum > 8)
    {
        cout << "Player count out of range!" << endl;
        return 1;
    }

    int maxRounds = 1100;
    if (parm.find("rounds") != parm.end())
        maxRounds = stoi(parm["rounds"]);

    string replayFile("replay.zip");
    if (parm.find("replay") != parm.end())
        replayFile = parm["replay"];

    setReplayFile(replayFile.c_str());

    init(playerNum);
    int id[MAXPLAYERNUM + 5] = {0};
    getPlayerIDs(id);

    for (int i = 0; i < playerNum; ++i)
    {
        string pname = "name" + to_string(i);
        string ppath = "path" + to_string(i);
        if (parm.find(ppath) == parm.end())
        {
            cout << "AI path of player #" << i << " not specified!" << endl;
            return 1;
        }
        if (parm.find(pname) == parm.end())
            parm[pname] = "Attendant";
        name[id[i]] = parm[pname];
        aipath[id[i]] = parm[ppath];

        setPlayerName(id[i], name[id[i]].c_str());
    }

    for (int i = 0; i < playerNum; ++i)
        if (!loadAI(aipath[id[i]].c_str(), id[i]))
        {
            cout << "Failed to load " << aipath[id[i]] << "!" << endl;
            return 1;
        }

    for (int i = 0; i < maxRounds; ++i)
    {
        invokeAI();
        run();
        if (checkWin() != -1)
            break;
    }

    int rank[MAXPLAYERNUM + 5] = {0};
    getRank(rank);

    for (int i = 0; i < playerNum; ++i)
        for (int j = 0; j < playerNum; ++j)
            if (rank[i] == id[j])
            {
                cout << j << " ";
                break;
            }
    cout << endl;

    closeReplayFile();
    return 0;
}